

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O2

void opj_t1_enc_sigpass_step
               (opj_t1_t *t1,opj_flag_t *flagsp,OPJ_INT32 *datap,OPJ_INT32 bpno,OPJ_INT32 one,
               OPJ_INT32 *nmsedec,OPJ_BYTE type,OPJ_UINT32 ci,OPJ_UINT32 vsc)

{
  uint uVar1;
  OPJ_UINT32 OVar2;
  byte bVar3;
  uint uVar4;
  OPJ_INT16 *pOVar5;
  uint uVar6;
  
  uVar4 = *flagsp;
  bVar3 = (char)ci * '\x03';
  if (((uVar4 >> (bVar3 & 0x1f) & 0x200010) == 0) && ((uVar4 >> (bVar3 & 0x1f) & 0x1ef) != 0)) {
    uVar1 = *datap;
    uVar6 = -uVar1;
    if (0 < (int)uVar1) {
      uVar6 = uVar1;
    }
    (t1->mqc).curctx =
         (t1->mqc).ctxs + (t1->mqc).lut_ctxno_zc_orient[uVar4 >> (bVar3 & 0x1f) & 0x1ef];
    uVar4 = (uint)((uVar6 & one) != 0);
    if (type == '\x01') {
      opj_mqc_bypass_enc(&t1->mqc,uVar4);
    }
    else {
      opj_mqc_encode(&t1->mqc,uVar4);
    }
    if ((uVar6 & one) != 0) {
      OVar2 = opj_t1_getctxtno_sc_or_spb_index(*flagsp,flagsp[-1],flagsp[1],ci);
      uVar4 = *datap;
      uVar6 = uVar4 >> 0x1f;
      uVar1 = -uVar4;
      if (0 < (int)uVar4) {
        uVar1 = uVar4;
      }
      pOVar5 = lut_nmsedec_sig;
      if (bpno == 0) {
        pOVar5 = lut_nmsedec_sig0;
      }
      *nmsedec = *nmsedec + (int)pOVar5[uVar1 >> ((byte)bpno & 0x1f) & 0x7f];
      (t1->mqc).curctx =
           (t1->mqc).ctxs +
           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
           [OVar2];
      if (type == '\x01') {
        opj_mqc_bypass_enc(&t1->mqc,uVar6);
      }
      else {
        opj_mqc_encode(&t1->mqc,""[OVar2] ^ uVar6);
      }
      opj_t1_update_flags(flagsp,ci,uVar6,t1->w + 2,vsc);
    }
    *flagsp = *flagsp | 0x200000 << (bVar3 & 0x1f);
  }
  return;
}

Assistant:

static INLINE void opj_t1_enc_sigpass_step(opj_t1_t *t1,
        opj_flag_t *flagsp,
        OPJ_INT32 *datap,
        OPJ_INT32 bpno,
        OPJ_INT32 one,
        OPJ_INT32 *nmsedec,
        OPJ_BYTE type,
        OPJ_UINT32 ci,
        OPJ_UINT32 vsc)
{
    OPJ_UINT32 v;

    opj_mqc_t *mqc = &(t1->mqc);   /* MQC component */

    OPJ_UINT32 const flags = *flagsp;

    if ((flags & ((T1_SIGMA_THIS | T1_PI_THIS) << (ci * 3U))) == 0U &&
            (flags & (T1_SIGMA_NEIGHBOURS << (ci * 3U))) != 0U) {
        OPJ_UINT32 ctxt1 = opj_t1_getctxno_zc(mqc, flags >> (ci * 3U));
        v = (opj_int_abs(*datap) & one) ? 1 : 0;
#ifdef DEBUG_ENC_SIG
        fprintf(stderr, "   ctxt1=%d\n", ctxt1);
#endif
        opj_mqc_setcurctx(mqc, ctxt1);
        if (type == T1_TYPE_RAW) {  /* BYPASS/LAZY MODE */
            opj_mqc_bypass_enc(mqc, v);
        } else {
            opj_mqc_encode(mqc, v);
        }
        if (v) {
            OPJ_UINT32 lu = opj_t1_getctxtno_sc_or_spb_index(
                                *flagsp,
                                flagsp[-1], flagsp[1],
                                ci);
            OPJ_UINT32 ctxt2 = opj_t1_getctxno_sc(lu);
            v = *datap < 0 ? 1U : 0U;
            *nmsedec += opj_t1_getnmsedec_sig((OPJ_UINT32)opj_int_abs(*datap),
                                              (OPJ_UINT32)bpno);
#ifdef DEBUG_ENC_SIG
            fprintf(stderr, "   ctxt2=%d\n", ctxt2);
#endif
            opj_mqc_setcurctx(mqc, ctxt2);
            if (type == T1_TYPE_RAW) {  /* BYPASS/LAZY MODE */
                opj_mqc_bypass_enc(mqc, v);
            } else {
                OPJ_UINT32 spb = opj_t1_getspb(lu);
#ifdef DEBUG_ENC_SIG
                fprintf(stderr, "   spb=%d\n", spb);
#endif
                opj_mqc_encode(mqc, v ^ spb);
            }
            opj_t1_update_flags(flagsp, ci, v, t1->w + 2, vsc);
        }
        *flagsp |= T1_PI_THIS << (ci * 3U);
    }
}